

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall CLIntercept::logDeviceInfo(CLIntercept *this,cl_device_id device)

{
  cl_int cVar1;
  cl_int cVar2;
  cl_int cVar3;
  cl_int cVar4;
  cl_int cVar5;
  cl_int cVar6;
  char *pcVar7;
  char *pcVar8;
  float __x;
  float fVar9;
  float __x_00;
  float extraout_XMM0_Da;
  double __x_01;
  undefined8 extraout_XMM0_Qa;
  undefined8 uVar10;
  undefined8 extraout_XMM0_Qa_00;
  char *deviceExtensions;
  char *driverVersion;
  char *deviceVersion;
  char *deviceVendor;
  char *deviceName;
  char *nextExtension;
  cl_device_type deviceType;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  string local_58;
  cl_device_type local_38;
  
  local_60 = (char *)0x0;
  local_68 = (char *)0x0;
  local_70 = (char *)0x0;
  local_78 = (char *)0x0;
  local_80 = (char *)0x0;
  cVar1 = (*(this->m_Dispatch).clGetDeviceInfo)(device,0x1000,8,&local_38,(size_t *)0x0);
  cVar2 = allocateAndGetDeviceInfoString(this,device,0x102b,&local_60);
  cVar3 = allocateAndGetDeviceInfoString(this,device,0x102c,&local_68);
  cVar4 = allocateAndGetDeviceInfoString(this,device,0x102f,&local_70);
  cVar5 = allocateAndGetDeviceInfoString(this,device,0x102d,&local_78);
  cVar6 = allocateAndGetDeviceInfoString(this,device,0x1030,&local_80);
  pcVar8 = local_60;
  if (cVar6 == 0 && ((cVar5 == 0 && (cVar4 == 0 && (cVar3 == 0 && cVar2 == 0))) && cVar1 == 0)) {
    fVar9 = logf(this,__x);
    fVar9 = logf(this,fVar9);
    fVar9 = logf(this,fVar9);
    logf(this,fVar9);
    CEnumNameMap::name_device_type_abi_cxx11_(&local_58,&this->m_EnumNameMap,local_38);
    fVar9 = logf(this,__x_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
      fVar9 = extraout_XMM0_Da;
    }
    fVar9 = logf(this,fVar9);
    if (local_80 != (char *)0x0) {
      local_58._M_dataplus._M_p = (pointer)0x0;
      pcVar7 = strtok_r(local_80," ",(char **)&local_58);
      fVar9 = (float)extraout_XMM0_Qa;
      if (pcVar7 != (char *)0x0) {
        uVar10 = extraout_XMM0_Qa;
        do {
          logf(this,(float)uVar10);
          pcVar7 = strtok_r((char *)0x0," ",(char **)&local_58);
          fVar9 = (float)extraout_XMM0_Qa_00;
          uVar10 = extraout_XMM0_Qa_00;
        } while (pcVar7 != (char *)0x0);
      }
    }
    logf(this,fVar9);
  }
  else {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Error getting device info!\n","");
    log(this,__x_01);
    pcVar8 = local_60;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
      pcVar8 = local_60;
    }
  }
  if (pcVar8 != (char *)0x0) {
    operator_delete__(pcVar8);
  }
  if (local_68 != (char *)0x0) {
    operator_delete__(local_68);
  }
  if (local_70 != (char *)0x0) {
    operator_delete__(local_70);
  }
  if (local_78 != (char *)0x0) {
    operator_delete__(local_78);
  }
  if (local_80 != (char *)0x0) {
    operator_delete__(local_80);
  }
  return;
}

Assistant:

void CLIntercept::logDeviceInfo( cl_device_id device )
{
    cl_int  errorCode = CL_SUCCESS;

    cl_device_type  deviceType;
    char*   deviceName = NULL;
    char*   deviceVendor = NULL;
    char*   deviceVersion = NULL;
    char*   driverVersion = NULL;
    char*   deviceExtensions = NULL;

    errorCode |= dispatch().clGetDeviceInfo(
        device,
        CL_DEVICE_TYPE,
        sizeof( deviceType ),
        &deviceType,
        NULL );
    errorCode |= allocateAndGetDeviceInfoString(
        device,
        CL_DEVICE_NAME,
        deviceName );
    errorCode |= allocateAndGetDeviceInfoString(
        device,
        CL_DEVICE_VENDOR,
        deviceVendor );
    errorCode |= allocateAndGetDeviceInfoString(
        device,
        CL_DEVICE_VERSION,
        deviceVersion );
    errorCode |= allocateAndGetDeviceInfoString(
        device,
        CL_DRIVER_VERSION,
        driverVersion );
    errorCode |= allocateAndGetDeviceInfoString(
        device,
        CL_DEVICE_EXTENSIONS,
        deviceExtensions );

    if( errorCode == CL_SUCCESS )
    {
        logf( "\tName:           %s\n", deviceName );
        logf( "\tVendor:         %s\n", deviceVendor );
        logf( "\tVersion:        %s\n", deviceVersion );
        logf( "\tDriver Version: %s\n", driverVersion );
        logf( "\tType:           %s\n", enumName().name_device_type( deviceType ).c_str() );

        int     numberOfExtensions = 0;
        logf( "\tExtensions:\n" );
        if( deviceExtensions )
        {
            char*   extension = NULL;
            char*   nextExtension = NULL;
            extension = CLI_STRTOK( deviceExtensions, " ", &nextExtension );
            while( extension != NULL )
            {
                numberOfExtensions++;
                logf( "\t\t%s\n", extension );
                extension = CLI_STRTOK( NULL, " ", &nextExtension );
            }
        }
        logf( "\t\t%d Device Extensions Found\n", numberOfExtensions );
    }
    else
    {
        log( "Error getting device info!\n" );
    }

    delete [] deviceName;
    delete [] deviceVendor;
    delete [] deviceVersion;
    delete [] driverVersion;
    delete [] deviceExtensions;
}